

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmain.c
# Opt level: O3

void p_libsys_init(void)

{
  if (pp_plibsys_inited == '\0') {
    pp_plibsys_inited = 1;
    p_mem_init();
    p_atomic_thread_init();
    p_socket_init_once();
    p_uthread_init();
    p_cond_variable_init();
    p_rwlock_init();
    p_time_profiler_init();
    p_library_loader_init();
    return;
  }
  return;
}

Assistant:

P_LIB_API void
p_libsys_init (void)
{
	if (P_UNLIKELY (pp_plibsys_inited == TRUE))
		return;

	pp_plibsys_inited = TRUE;

	p_mem_init ();
	p_atomic_thread_init ();
	p_socket_init_once ();
	p_uthread_init ();
	p_cond_variable_init ();
	p_rwlock_init ();
	p_time_profiler_init ();
	p_library_loader_init ();
}